

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O2

void __thiscall
BamTools::SplitTool::SplitToolPrivate::DetermineOutputFilenameStub(SplitToolPrivate *this)

{
  SplitSettings *pSVar1;
  string local_30;
  
  pSVar1 = this->m_settings;
  if (pSVar1->HasCustomOutputStub == true) {
    std::__cxx11::string::_M_assign((string *)&this->m_outputFilenameStub);
    return;
  }
  if (pSVar1->HasInputFilename == true) {
    RemoveFilenameExtension(&local_30,&pSVar1->InputFilename);
  }
  else {
    GetTimestampString_abi_cxx11_();
  }
  std::__cxx11::string::operator=((string *)&this->m_outputFilenameStub,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SplitTool::SplitToolPrivate::DetermineOutputFilenameStub()
{

    // if user supplied output filename stub, use that
    if (m_settings->HasCustomOutputStub) m_outputFilenameStub = m_settings->CustomOutputStub;

    // else if user supplied input BAM filename, use that (minus ".bam" extension) as stub
    else if (m_settings->HasInputFilename)
        m_outputFilenameStub = RemoveFilenameExtension(m_settings->InputFilename);

    // otherwise, user did not specify -stub, and input is coming from STDIN
    // generate stub from timestamp
    else
        m_outputFilenameStub = GetTimestampString();
}